

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::inertia::anon_unknown_0::mark_half(anon_unknown_0 *this,Reals *distances,Real distance)

{
  LO size_in;
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_c8;
  undefined1 local_b8 [8];
  type f;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  Write<signed_char> marked;
  LO n;
  Real distance_local;
  Reals *distances_local;
  ulong local_10;
  
  if (((ulong)(distances->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((distances->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(distances->write_).shared_alloc_.alloc >> 3;
  }
  size_in = (LO)(local_10 >> 3);
  marked.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Write<signed_char>::Write((Write<signed_char> *)local_58,size_in,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Write<signed_char>::Write((Write<signed_char> *)local_b8,(Write<signed_char> *)local_58);
  Read<double>::Read((Read<double> *)&f.marked.shared_alloc_.direct_ptr,distances);
  f.distances.write_.shared_alloc_.direct_ptr = (void *)distance;
  parallel_for<Omega_h::inertia::(anonymous_namespace)::mark_half(Omega_h::Read<double>,double)::__0>
            (marked.shared_alloc_.direct_ptr._4_4_,(type *)local_b8,"mark_half");
  Write<signed_char>::Write(&local_c8,(Write<signed_char> *)local_58);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_c8);
  Write<signed_char>::~Write(&local_c8);
  (anonymous_namespace)::mark_half(Omega_h::Read<double>,double)::$_0::~__0((__0 *)local_b8);
  Write<signed_char>::~Write((Write<signed_char> *)local_58);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_half(Reals distances, Real distance) {
  auto n = distances.size();
  Write<I8> marked(n);
  auto f = OMEGA_H_LAMBDA(LO i) { marked[i] = (distances[i] > distance); };
  parallel_for(n, f, "mark_half");
  return marked;
}